

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O1

connectbundle * Curl_conncache_find_bundle(connectdata *conn,conncache *connc)

{
  char *__s;
  size_t key_len;
  connectbundle *pcVar1;
  
  if ((connc != (conncache *)0x0) &&
     (__s = curl_maprintf("%s:%d",*(undefined8 *)
                                   (conn->primary_ip + (ulong)(conn->bits).proxy * 0x20 + -0x3c),
                          (ulong)conn->localport), __s != (char *)0x0)) {
    key_len = strlen(__s);
    pcVar1 = (connectbundle *)Curl_hash_pick(&connc->hash,__s,key_len);
    (*Curl_cfree)(__s);
    return pcVar1;
  }
  return (connectbundle *)0x0;
}

Assistant:

struct connectbundle *Curl_conncache_find_bundle(struct connectdata *conn,
                                                 struct conncache *connc)
{
  struct connectbundle *bundle = NULL;
  if(connc) {
    char *key = hashkey(conn);
    if(key) {
      bundle = Curl_hash_pick(&connc->hash, key, strlen(key));
      free(key);
    }
  }

  return bundle;
}